

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacheck.hpp
# Opt level: O1

ostream * __thiscall
mc::detail::
section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_6U,_mc::seed_state<5568859697023421760UL>,_kvasir::mpl::list<kvasir::mpl::uint_<0ULL>,_char_*&>_>_>_>
::print(section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_6U,_mc::seed_state<5568859697023421760UL>,_kvasir::mpl::list<kvasir::mpl::uint_<0ULL>,_char_*&>_>_>_>
        *this,ostream *stream,string *test_root)

{
  pointer pcVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  string new_root;
  error<testns::reverse_test,10u,10u,6u,mc::seed_state<5568859697023421760ul>,kvasir::mpl::list<kvasir::mpl::uint_<0ull>,char*&>>
  local_69;
  long *local_68;
  long local_60;
  long local_58 [2];
  string local_48;
  
  pcVar1 = (test_root->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + test_root->_M_string_length);
  pcVar2 = (char *)std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::append(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[----------] ",0xd);
  (**(this->super_section_base)._vptr_section_base)(this);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," tests from ",0xc);
  pcVar2 = (this->super_section_base).name;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_68,local_60 + (long)local_68);
  error<testns::reverse_test,10u,10u,6u,mc::seed_state<5568859697023421760ul>,kvasir::mpl::list<kvasir::mpl::uint_<0ull>,char*&>>
  ::print<std::ostream&>(&local_69,stream,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[----------] ",0xd);
  (**(this->super_section_base)._vptr_section_base)(this);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," tests from ",0xc);
  pcVar2 = (this->super_section_base).name;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (0 ms total)",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return stream;
}

Assistant:

std::ostream &print(std::ostream &stream, std::string &test_root) const override {
				std::string new_root{test_root};
				new_root.append(name).append(".");
				// replace the root name with the current section for now
				stream << "[----------] " << num_tests() << " tests from " << name << std::endl;
				print_all_tuple(stream, new_root, results);
				stream << "[----------] " << num_tests() << " tests from " << name
				       << " (0 ms total)" << std::endl;
				return stream;
			}